

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult __thiscall
testing::internal::
CmpHelperEQ<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
          (internal *this,char *expected_expression,char *actual_expression,
          BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *expected,
          BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *actual)

{
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  bool bVar2;
  AssertionResult AVar3;
  string local_60;
  string local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  bVar2 = (actual->super_ExprBase).impl_ != (Impl *)0x0;
  if (((expected->super_ExprBase).impl_ == (Impl *)0x0) == bVar2) {
    PrintToString<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
              (&local_40,(testing *)expected,
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
               CONCAT71((int7)((ulong)actual_expression >> 8),bVar2));
    PrintToString<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
              (&local_60,(testing *)actual,value);
    AVar3 = EqFailure(this,expected_expression,actual_expression,&local_40,&local_60,false);
    sVar1 = AVar3.message_.ptr_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      sVar1.ptr_ = extraout_RDX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      sVar1.ptr_ = extraout_RDX_00;
    }
  }
  else {
    AVar3 = AssertionSuccess();
    sVar1 = AVar3.message_.ptr_;
  }
  AVar3.message_.ptr_ = sVar1.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}